

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

void ctemplate::TemplateDictionary::SetupGlobalDict(void)

{
  TemplateString key;
  TemplateString key_00;
  TemplateString value;
  TemplateString value_00;
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
  *psVar1;
  TemplateString *this;
  TemplateString local_98;
  TemplateString local_78;
  TemplateString local_58;
  TemplateString local_38;
  
  psVar1 = (small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
            *)operator_new(0xa8);
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
  ::small_map(psVar1);
  global_dict_ = psVar1;
  TemplateString::TemplateString(&local_38,"BI_SPACE");
  TemplateString::TemplateString(&local_58," ");
  key.length_ = local_38.length_;
  key.ptr_ = local_38.ptr_;
  key.is_immutable_ = local_38.is_immutable_;
  key._17_7_ = local_38._17_7_;
  key.id_ = local_38.id_;
  value.length_ = local_58.length_;
  value.ptr_ = local_58.ptr_;
  value.is_immutable_ = local_58.is_immutable_;
  value._17_7_ = local_58._17_7_;
  value.id_ = local_58.id_;
  HashInsert<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>,4,std::equal_to<unsigned_long>,ctemplate::small_map_default_init<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>>>,ctemplate::TemplateString>
            (psVar1,key,value);
  psVar1 = global_dict_;
  TemplateString::TemplateString(&local_78,"BI_NEWLINE");
  TemplateString::TemplateString(&local_98,"\n");
  key_00.length_ = local_78.length_;
  key_00.ptr_ = local_78.ptr_;
  key_00.is_immutable_ = local_78.is_immutable_;
  key_00._17_7_ = local_78._17_7_;
  key_00.id_ = local_78.id_;
  value_00.length_ = local_98.length_;
  value_00.ptr_ = local_98.ptr_;
  value_00.is_immutable_ = local_98.is_immutable_;
  value_00._17_7_ = local_98._17_7_;
  value_00.id_ = local_98.id_;
  HashInsert<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>,4,std::equal_to<unsigned_long>,ctemplate::small_map_default_init<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>>>,ctemplate::TemplateString>
            (psVar1,key_00,value_00);
  this = (TemplateString *)operator_new(0x20);
  TemplateString::TemplateString(this,"");
  empty_string_ = this;
  return;
}

Assistant:

void TemplateDictionary::SetupGlobalDict()
    NO_THREAD_SAFETY_ANALYSIS {
  global_dict_ = new TemplateDictionary::GlobalDict;
  // Initialize the built-ins
  HashInsert(global_dict_, TemplateString("BI_SPACE"), TemplateString(" "));
  HashInsert(global_dict_, TemplateString("BI_NEWLINE"), TemplateString("\n"));
  // This is used for name-lookup misses.
  empty_string_ = new TemplateString("");
}